

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_imexmri.c
# Opt level: O0

int ff(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  undefined8 *puVar10;
  long *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sunindextype i;
  sunrealtype w;
  sunrealtype v;
  sunrealtype u;
  sunrealtype *dYdata;
  sunrealtype *Ydata;
  sunrealtype ep;
  sunrealtype b;
  sunrealtype a;
  sunindextype N;
  UserData udata;
  int in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  long lVar11;
  void *in_stack_ffffffffffffff88;
  int local_4;
  
  lVar7 = *in_RDX;
  dVar1 = (double)in_RDX[2];
  dVar2 = (double)in_RDX[3];
  dVar3 = (double)in_RDX[0xb];
  lVar9 = N_VGetArrayPointer(in_RDI);
  iVar8 = check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c
                      );
  if (iVar8 == 0) {
    puVar10 = (undefined8 *)N_VGetArrayPointer(in_RSI);
    iVar8 = check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffff7c);
    if (iVar8 == 0) {
      N_VConst(in_RSI);
      for (lVar11 = 1; lVar11 < lVar7 + -1; lVar11 = lVar11 + 1) {
        dVar4 = *(double *)(lVar9 + lVar11 * 0x18);
        dVar5 = *(double *)(lVar9 + 8 + lVar11 * 0x18);
        dVar6 = *(double *)(lVar9 + 0x10 + lVar11 * 0x18);
        puVar10[lVar11 * 3] = dVar5 * dVar4 * dVar4 + -(dVar6 + 1.0) * dVar4 + dVar1;
        puVar10[lVar11 * 3 + 1] = dVar6 * dVar4 + -(dVar5 * dVar4 * dVar4);
        puVar10[lVar11 * 3 + 2] = -dVar6 * dVar4 + (dVar2 - dVar6) / dVar3;
      }
      puVar10[2] = 0;
      puVar10[1] = 0;
      *puVar10 = 0;
      puVar10[(lVar7 + -1) * 3 + 2] = 0;
      puVar10[(lVar7 + -1) * 3 + 1] = 0;
      puVar10[(lVar7 + -1) * 3] = 0;
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int ff(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData udata     = (UserData)user_data; /* access problem data */
  sunindextype N     = udata->N;            /* set variable shortcuts */
  sunrealtype a      = udata->a;
  sunrealtype b      = udata->b;
  sunrealtype ep     = udata->ep;
  sunrealtype *Ydata = NULL, *dYdata = NULL;
  sunrealtype u, v, w;
  sunindextype i;

  Ydata = N_VGetArrayPointer(y); /* access data arrays */
  if (check_retval((void*)Ydata, "N_VGetArrayPointer", 0)) { return 1; }
  dYdata = N_VGetArrayPointer(ydot);
  if (check_retval((void*)dYdata, "N_VGetArrayPointer", 0)) { return 1; }
  N_VConst(0.0, ydot); /* initialize ydot to zero */

  /* iterate over domain, computing all equations */
  for (i = 1; i < N - 1; i++)
  {
    /* set shortcuts */
    u = Ydata[IDX(i, 0)];
    v = Ydata[IDX(i, 1)];
    w = Ydata[IDX(i, 2)];

    /* Fill in ODE RHS for u */
    dYdata[IDX(i, 0)] = a - (w + ONE) * u + v * u * u;

    /* Fill in ODE RHS for v */
    dYdata[IDX(i, 1)] = w * u - v * u * u;

    /* Fill in ODE RHS for w */
    dYdata[IDX(i, 2)] = (b - w) / ep - w * u;
  }

  /* enforce stationary boundaries */
  dYdata[IDX(0, 0)] = dYdata[IDX(0, 1)] = dYdata[IDX(0, 2)] = 0.0;
  dYdata[IDX(N - 1, 0)] = dYdata[IDX(N - 1, 1)] = dYdata[IDX(N - 1, 2)] = 0.0;

  /* Return with success */
  return 0;
}